

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  Point2f st;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  SampledSpectrum SVar8;
  Tuple3<pbrt::Vector3,_float> local_20;
  
  fVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar5 = auVar6._0_4_;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar4,auVar4);
  auVar3 = vfmadd231ss_fma(auVar3,auVar7,auVar7);
  if (auVar3._0_4_ < 0.0) {
    local_20.z = sqrtf(auVar3._0_4_);
    auVar7 = ZEXT416(auVar7._0_4_);
    auVar6 = ZEXT416((uint)fVar5);
    auVar4 = ZEXT416(auVar4._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    local_20.z = auVar3._0_4_;
  }
  auVar3._0_4_ = auVar4._0_4_ / local_20.z;
  auVar3._4_12_ = auVar4._4_12_;
  auVar4._0_4_ = auVar6._0_4_ / local_20.z;
  auVar4._4_12_ = auVar6._4_12_;
  auVar4 = vinsertps_avx(auVar3,auVar4,0x10);
  local_20.z = auVar7._0_4_ / local_20.z;
  local_20._0_8_ = vmovlps_avx(auVar4);
  st = EqualAreaSphereToSquare((Vector3f *)&local_20);
  SVar8 = LookupLe(this,st,lambda);
  return (array<float,_4>)(array<float,_4>)SVar8;
}

Assistant:

Le(const Ray &ray, const SampledWavelengths &lambda) const {
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
        Point2f st = EqualAreaSphereToSquare(wl);
        return LookupLe(st, lambda);
    }